

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O1

void cfd::core::ConvertFromUniValue<unsigned_int>(uint *value,UniValue *json_value)

{
  char *pcVar1;
  pointer pcVar2;
  int iVar3;
  string *psVar4;
  CfdException *pCVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  string str;
  UniValue json_value_copy;
  char *local_120;
  long local_118;
  char local_110 [16];
  UniValue local_100;
  string local_a8;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  char local_70 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<UniValue,_std::allocator<UniValue>_> local_48;
  
  local_88._0_4_ = json_value->typ;
  local_80._M_p = local_70;
  pcVar2 = (json_value->val)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar2,pcVar2 + (json_value->val)._M_string_length);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60,&json_value->keys);
  ::std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_48,&json_value->values);
  if (local_88._0_4_ != VSTR) goto LAB_00491274;
  psVar4 = UniValue::get_str_abi_cxx11_(json_value);
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  local_120 = local_110;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,pcVar2,pcVar2 + psVar4->_M_string_length);
  iVar3 = ::std::__cxx11::string::compare((char *)&local_120);
  if (iVar3 == 0) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"0","");
    UniValue::UniValue(&local_100,VNUM,&local_a8);
    local_88._0_4_ = local_100.typ;
    ::std::__cxx11::string::_M_assign((string *)&local_80);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_60,&local_100.keys);
    ::std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&local_48,&local_100.values);
    UniValue::~UniValue(&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  else {
    uVar10 = (ulong)(*local_120 == '-');
    pcVar1 = local_120 + local_118;
    lVar9 = (long)(local_118 - uVar10) >> 2;
    uVar6 = uVar10;
    if (0 < lVar9) {
      uVar6 = local_118 - uVar10 & 0xfffffffffffffffc | uVar10;
      lVar9 = lVar9 + 1;
      pcVar8 = local_120 + uVar10 + 1;
      do {
        if ((int)pcVar8[-1] - 0x3aU < 0xfffffff6) {
          pcVar8 = pcVar8 + -1;
          goto LAB_0049120b;
        }
        if ((int)*pcVar8 - 0x3aU < 0xfffffff6) goto LAB_0049120b;
        if ((int)pcVar8[1] - 0x3aU < 0xfffffff6) {
          pcVar8 = pcVar8 + 1;
          goto LAB_0049120b;
        }
        if ((int)pcVar8[2] - 0x3aU < 0xfffffff6) {
          pcVar8 = pcVar8 + 2;
          goto LAB_0049120b;
        }
        lVar9 = lVar9 + -1;
        pcVar8 = pcVar8 + 4;
      } while (1 < lVar9);
    }
    pcVar7 = local_120 + uVar6;
    lVar9 = (long)pcVar1 - (long)pcVar7;
    if (lVar9 == 1) {
LAB_004911eb:
      pcVar8 = pcVar7;
      if (0xfffffff5 < (int)*pcVar7 - 0x3aU) {
        pcVar8 = pcVar1;
      }
    }
    else if (lVar9 == 2) {
LAB_004911dd:
      pcVar8 = pcVar7;
      if (0xfffffff5 < (int)*pcVar7 - 0x3aU) {
        pcVar7 = pcVar7 + 1;
        goto LAB_004911eb;
      }
    }
    else {
      pcVar8 = pcVar1;
      if ((lVar9 == 3) && (pcVar8 = pcVar7, 0xfffffff5 < (int)*pcVar7 - 0x3aU)) {
        pcVar7 = pcVar7 + 1;
        goto LAB_004911dd;
      }
    }
LAB_0049120b:
    if (pcVar8 == pcVar1) {
      psVar4 = UniValue::get_str_abi_cxx11_(json_value);
      UniValue::UniValue(&local_100,VNUM,psVar4);
      local_88._0_4_ = local_100.typ;
      ::std::__cxx11::string::_M_assign((string *)&local_80);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_60,&local_100.keys);
      ::std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&local_48,&local_100.values);
      UniValue::~UniValue(&local_100);
    }
  }
  if (local_120 != local_110) {
    operator_delete(local_120);
  }
LAB_00491274:
  if (local_88._0_4_ != VNUM) {
    local_100._0_8_ = "cfdcore_json_mapping_base.h";
    local_100.val._M_dataplus._M_p._0_4_ = 0x100;
    local_100.val._M_string_length = 0x5f777a;
    logger::log<>((CfdSourceLocation *)&local_100,kCfdLogLevelWarning,"Invalid json format.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_100._0_8_ = &local_100.val._M_string_length;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Json value convert error. Invalid json format.","");
    CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)&local_100);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_120 = (char *)UniValue::get_int64((UniValue *)local_88);
  if ((ulong)local_120 >> 0x20 != 0) {
    local_100._0_8_ = "cfdcore_json_mapping_base.h";
    local_100.val._M_dataplus._M_p._0_4_ = 0xef;
    local_100.val._M_string_length = 0x5f777a;
    logger::log<long_const&>
              ((CfdSourceLocation *)&local_100,kCfdLogLevelWarning,
               "Invalid json_value. : json_value={}",(long *)&local_120);
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_100._0_8_ = &local_100.val._M_string_length;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Json value convert error. Value out of range.","");
    CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)&local_100);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  *value = (uint)local_120;
  UniValue::~UniValue((UniValue *)local_88);
  return;
}

Assistant:

inline void ConvertFromUniValue(
    T& value, const UniValue& json_value) {  // NOLINT
  using cfd::core::CfdError;
  using cfd::core::CfdException;
  using cfd::core::logger::warn;
  UniValue json_value_copy = json_value;
  if (json_value_copy.isStr()) {
    auto str = json_value.get_str();
    if (str == "0n") {
      json_value_copy = UniValue(UniValue::VNUM, "0");
    } else {
      auto begin_pos = str.begin();
      if (*begin_pos == '-') ++begin_pos;
      bool is_digits_only = std::all_of(begin_pos, str.end(), ::isdigit);
      // check max of int64 : execute call get_int64()
      if (is_digits_only) {
        json_value_copy = UniValue(UniValue::VNUM, json_value.get_str());
      }
    }
  }

  if (json_value_copy.isNum()) {
    const int64_t num = json_value_copy.get_int64();
    if (std::is_unsigned<T>::value) {
      uint64_t unsigned_num = static_cast<uint64_t>(num);
      uint64_t maximum = static_cast<uint64_t>(std::numeric_limits<T>::max());
      if ((num < 0) || (maximum < unsigned_num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    } else {
      int64_t maximum = static_cast<int64_t>(std::numeric_limits<T>::max());
      int64_t minimum = static_cast<int64_t>(std::numeric_limits<T>::min());
      if ((maximum < num) || (minimum > num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    }
    value = static_cast<T>(num);
  } else {
    warn(CFD_LOG_SOURCE, "Invalid json format.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Json value convert error. Invalid json format.");
  }
}